

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t joint_strength_search_dual
                   (int *best_lev0,int *best_lev1,int nb_strengths,uint64_t (**mse) [64],
                   int sb_count,CDEF_PICK_METHOD pick_method)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  uint64_t best_tot_mse;
  CDEF_PICK_METHOD in_stack_00008010;
  int in_stack_00008014;
  uint64_t (**in_stack_00008018) [64];
  int in_stack_00008024;
  int *in_stack_00008028;
  int *in_stack_00008030;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  
  local_30 = 0x8000000000000000;
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    local_30 = search_one_dual(in_stack_00008030,in_stack_00008028,in_stack_00008024,
                               in_stack_00008018,in_stack_00008014,in_stack_00008010);
  }
  for (local_34 = 0; local_34 < in_EDX * 4; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_EDX + -1; local_38 = local_38 + 1) {
      *(undefined4 *)(in_RDI + (long)local_38 * 4) =
           *(undefined4 *)(in_RDI + (long)(local_38 + 1) * 4);
      *(undefined4 *)(in_RSI + (long)local_38 * 4) =
           *(undefined4 *)(in_RSI + (long)(local_38 + 1) * 4);
    }
    local_30 = search_one_dual(in_stack_00008030,in_stack_00008028,in_stack_00008024,
                               in_stack_00008018,in_stack_00008014,in_stack_00008010);
  }
  return local_30;
}

Assistant:

static uint64_t joint_strength_search_dual(int *best_lev0, int *best_lev1,
                                           int nb_strengths,
                                           uint64_t (**mse)[TOTAL_STRENGTHS],
                                           int sb_count,
                                           CDEF_PICK_METHOD pick_method) {
  uint64_t best_tot_mse;
  int i;
  best_tot_mse = (uint64_t)1 << 63;
  /* Greedy search: add one strength options at a time. */
  for (i = 0; i < nb_strengths; i++) {
    best_tot_mse =
        search_one_dual(best_lev0, best_lev1, i, mse, sb_count, pick_method);
  }
  /* Trying to refine the greedy search by reconsidering each
     already-selected option. */
  for (i = 0; i < 4 * nb_strengths; i++) {
    int j;
    for (j = 0; j < nb_strengths - 1; j++) {
      best_lev0[j] = best_lev0[j + 1];
      best_lev1[j] = best_lev1[j + 1];
    }
    best_tot_mse = search_one_dual(best_lev0, best_lev1, nb_strengths - 1, mse,
                                   sb_count, pick_method);
  }
  return best_tot_mse;
}